

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
pbrt::SplitStringsFromWhitespace_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,pbrt *this,string_view str)

{
  int iVar1;
  pbrt *ppVar2;
  pbrt *ppVar3;
  pbrt *ppVar4;
  pbrt *ppVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppVar3 = (pbrt *)str._M_len;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar5 = this + (long)ppVar3;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    while ((ppVar4 = ppVar5, ppVar2 = ppVar5, ppVar3 != ppVar5 &&
           (iVar1 = isspace((int)(char)*ppVar3), ppVar4 = ppVar3, ppVar2 = ppVar3, iVar1 != 0))) {
      ppVar3 = ppVar3 + 1;
    }
    while ((ppVar3 = ppVar5, ppVar4 != ppVar5 &&
           (iVar1 = isspace((int)(char)*ppVar4), ppVar3 = ppVar4, iVar1 == 0))) {
      ppVar4 = ppVar4 + 1;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,ppVar2,ppVar3);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  } while (ppVar4 != ppVar5);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> SplitStringsFromWhitespace(std::string_view str) {
    std::vector<std::string> ret;

    std::string_view::iterator start = str.begin();
    do {
        // skip leading ws
        while (start != str.end() && isspace(*start))
            ++start;

        // |start| is at the start of the current word
        auto end = start;
        while (end != str.end() && !isspace(*end))
            ++end;

        ret.push_back(std::string(start, end));
        start = end;
    } while (start != str.end());

    return ret;
}